

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol_check.h
# Opt level: O2

void __thiscall
mp::
SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::Gen1Viol(SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,ViolSummary *vs,MemoryWriter *wrt,bool f_max,string *type)

{
  string vmaxrel;
  string vmaxabs;
  string local_60;
  string local_40;
  
  if (vs->N_ != 0) {
    fmt::BasicWriter<char>::write<std::__cxx11::string>
              (&wrt->super_BasicWriter<char>,(BasicCStringRef<char>)0x2ae653,type);
    SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
    ::Gen1ViolMax_abi_cxx11_(&local_40,this,f_max,vs->epsAbsMax_,vs->nameAbs_);
    SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
    ::Gen1ViolMax_abi_cxx11_(&local_60,this,f_max,vs->epsRelMax_,vs->nameRel_);
    fmt::BasicWriter<char>::write<std::__cxx11::string>
              (&wrt->super_BasicWriter<char>,(BasicCStringRef<char>)0x2ae65b,&local_40);
    fmt::BasicWriter<char>::write<std::__cxx11::string>
              (&wrt->super_BasicWriter<char>,(BasicCStringRef<char>)0x2ae65b,&local_60);
    fmt::BasicWriter<char>::write<>(&wrt->super_BasicWriter<char>,(BasicCStringRef<char>)0x2bd523);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void Gen1Viol(
      const ViolSummary& vs, fmt::MemoryWriter& wrt,
      bool f_max, const std::string& type) {
    if (vs.N_) {
      // wrt.write("  {:16} {:<7}", type, vs.N_);
      wrt.write("  {:27}", type);
      auto vmaxabs = Gen1ViolMax(  // true: 1 for logical
            f_max, vs.epsAbsMax_, vs.nameAbs_);
      auto vmaxrel = Gen1ViolMax(
            f_max, vs.epsRelMax_, vs.nameRel_);
      wrt.write("  {:14}", vmaxabs);
      wrt.write("  {:14}", vmaxrel);
      wrt.write("\n");
    }
  }